

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O3

void initialize(void)

{
  _func_uint8_t_uint32_t_access_type_t *p_Var1;
  uint8_t *puVar2;
  uint8_t *__ptr;
  _func_uint16_t_uint32_t_access_type_t *p_Var3;
  _func_uint32_t_uint32_t_access_type_t *p_Var4;
  _func_void_uint32_t_uint8_t_access_type_t *p_Var5;
  _func_void_uint32_t_uint16_t_access_type_t *p_Var6;
  _func_void_uint32_t_uint32_t_access_type_t *p_Var7;
  _func_void_int *p_Var8;
  char *pcVar9;
  char **ppcVar10;
  arm7tdmi_t *paVar11;
  gbamem_t *pgVar12;
  int iVar13;
  FILE *__stream;
  int in_ESI;
  SDL_Renderer *pSVar14;
  undefined1 auStack_60 [8];
  size_t sStack_58;
  size_t sStack_50;
  size_t sStack_48;
  size_t sStack_40;
  size_t sStack_38;
  size_t sStack_30;
  
  initialized = 1;
  pSVar14 = (SDL_Renderer *)0x2020;
  iVar13 = SDL_Init();
  if (iVar13 < 0) {
    initialize_cold_2();
  }
  else {
    window = (SDL_Window *)
             SDL_CreateWindow("dgb gba",0x1fff0000,0x1fff0000,SCREEN_SCALE * 0xf0,
                              SCREEN_SCALE * 0xa0,4);
    window_id = SDL_GetWindowID(window);
    renderer = (SDL_Renderer *)SDL_CreateRenderer(window,0xffffffff,6);
    in_ESI = 0x16862004;
    buffer = (SDL_Texture *)SDL_CreateTexture(renderer,0x16862004,1,0xf0,0xa0);
    pSVar14 = renderer;
    if (renderer != (SDL_Renderer *)0x0) {
      SDL_RenderSetScale((float)SCREEN_SCALE,(float)SCREEN_SCALE);
      return;
    }
  }
  iVar13 = (int)pSVar14;
  initialize_cold_1();
  if (iVar13 != 0) {
    if (ctrl_state != true) {
      save_state(mem->savestate_path[in_ESI]);
      return;
    }
    __stream = fopen(mem->savestate_path[in_ESI],"rb");
    if (__stream != (FILE *)0x0) {
      fread(auStack_60,0x38,1,__stream);
      p_Var1 = cpu->read_byte;
      p_Var3 = cpu->read_half;
      p_Var4 = cpu->read_word;
      p_Var5 = cpu->write_byte;
      p_Var6 = cpu->write_half;
      p_Var7 = cpu->write_word;
      p_Var8 = cpu->cpu_idle;
      fread(cpu,sStack_58,1,__stream);
      cpu->read_byte = p_Var1;
      paVar11 = cpu;
      cpu->read_half = p_Var3;
      paVar11->read_word = p_Var4;
      paVar11->write_byte = p_Var5;
      paVar11->write_half = p_Var6;
      paVar11->write_word = p_Var7;
      paVar11->cpu_idle = p_Var8;
      fread(ppu,sStack_50,1,__stream);
      fread(bus,sStack_48,1,__stream);
      puVar2 = mem->rom;
      __ptr = mem->backup;
      pcVar9 = mem->backup_path;
      ppcVar10 = mem->savestate_path;
      fread(mem,sStack_40,1,__stream);
      mem->rom = puVar2;
      pgVar12 = mem;
      mem->backup_path = pcVar9;
      pgVar12->savestate_path = ppcVar10;
      pgVar12->backup = __ptr;
      fread(__ptr,sStack_38,1,__stream);
      fread(apu,sStack_30,1,__stream);
    }
    return;
  }
  return;
}

Assistant:

void initialize() {
    initialized = true;
    if (SDL_Init(SDL_INIT_VIDEO | SDL_INIT_GAMECONTROLLER) < 0) {
        logfatal("SDL couldn't initialize! %s", SDL_GetError());
    }

    window = SDL_CreateWindow("dgb gba",
            SDL_WINDOWPOS_UNDEFINED,
            SDL_WINDOWPOS_UNDEFINED,
            GBA_SCREEN_X * SCREEN_SCALE,
            GBA_SCREEN_Y * SCREEN_SCALE,
            SDL_WINDOW_SHOWN);
    window_id = SDL_GetWindowID(window);

    renderer = SDL_CreateRenderer(window, -1, SDL_RENDERER_ACCELERATED | SDL_RENDERER_PRESENTVSYNC);
    buffer = SDL_CreateTexture(renderer, SDL_PIXELFORMAT_ARGB32, SDL_TEXTUREACCESS_STREAMING, GBA_SCREEN_X, GBA_SCREEN_Y);

    if (renderer == NULL) {
        logfatal("SDL couldn't create a renderer! %s", SDL_GetError());
    }

    SDL_RenderSetScale(renderer, SCREEN_SCALE, SCREEN_SCALE);
}